

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall dynet::Trainer::rescale_and_reset_weight_decay(Trainer *this)

{
  float fVar1;
  pointer ppPVar2;
  ParameterStorage *pPVar3;
  pointer ppLVar4;
  LookupParameterStorage *pLVar5;
  int iVar6;
  ParameterCollectionStorage *pPVar7;
  pointer ppPVar8;
  pointer ppLVar9;
  
  pPVar7 = ParameterCollection::get_storage(this->model);
  fVar1 = (pPVar7->weight_decay).weight_decay;
  pPVar7 = ParameterCollection::get_storage(this->model);
  ppPVar2 = (pPVar7->params).
            super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar8 = (pPVar7->params).
                 super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppPVar8 != ppPVar2;
      ppPVar8 = ppPVar8 + 1) {
    pPVar3 = *ppPVar8;
    iVar6 = (*(pPVar3->super_ParameterStorageBase)._vptr_ParameterStorageBase[5])(pPVar3);
    if ((char)iVar6 != '\0') {
      (**(pPVar3->super_ParameterStorageBase)._vptr_ParameterStorageBase)(fVar1,pPVar3);
    }
  }
  pPVar7 = ParameterCollection::get_storage(this->model);
  ppLVar4 = (pPVar7->lookup_params).
            super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar9 = (pPVar7->lookup_params).
                 super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppLVar9 != ppLVar4;
      ppLVar9 = ppLVar9 + 1) {
    pLVar5 = *ppLVar9;
    iVar6 = (*(pLVar5->super_ParameterStorageBase)._vptr_ParameterStorageBase[5])(pLVar5);
    if ((char)iVar6 != '\0') {
      (**(pLVar5->super_ParameterStorageBase)._vptr_ParameterStorageBase)(fVar1,pLVar5);
    }
  }
  pPVar7 = ParameterCollection::get_storage(this->model);
  L2WeightDecay::reset_weight_decay(&pPVar7->weight_decay);
  return;
}

Assistant:

void Trainer::rescale_and_reset_weight_decay() {
  const float weight_decay = model->get_weight_decay().current_weight_decay();
  for (auto p : model->parameters_list())
    if (p->is_updated())
      p->scale_parameters(weight_decay);
  for (auto p : model->lookup_parameters_list())
    if (p->is_updated())
      p->scale_parameters(weight_decay);
  model->get_weight_decay().reset_weight_decay();
}